

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx *mtctx)

{
  undefined8 *puVar1;
  ZSTDMT_jobDescription *pZVar2;
  __pthread_internal_list *p_Var3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  __atomic_wide_counter _Var8;
  longlong lVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint jobID;
  uint uVar14;
  ulong uVar15;
  buffer_t buf;
  pthread_mutex_t mutex;
  pthread_cond_t cond;
  
  uVar15 = 0;
  do {
    pZVar2 = mtctx->jobs;
    p_Var3 = pZVar2[uVar15].job_mutex.__data.__list.__next;
    lVar4 = pZVar2[uVar15].job_mutex.__align;
    uVar5 = *(undefined8 *)((long)&pZVar2[uVar15].job_mutex + 8);
    puVar1 = (undefined8 *)((long)&pZVar2[uVar15].job_mutex + 0x10);
    uVar6 = *puVar1;
    uVar7 = puVar1[1];
    _Var8 = pZVar2[uVar15].job_cond.__data.__wseq;
    lVar9 = (&pZVar2[uVar15].job_cond.__align)[1];
    puVar1 = (undefined8 *)((long)&pZVar2[uVar15].job_cond + 0x10);
    uVar10 = *puVar1;
    uVar11 = puVar1[1];
    puVar1 = (undefined8 *)((long)&pZVar2[uVar15].job_cond + 0x20);
    uVar12 = *puVar1;
    uVar13 = puVar1[1];
    buf.capacity = pZVar2[uVar15].dstBuff.capacity;
    buf.start = pZVar2[uVar15].dstBuff.start;
    ZSTDMT_releaseBuffer(mtctx->bufPool,buf);
    memset(mtctx->jobs + uVar15,0,0x1b8);
    pZVar2 = mtctx->jobs;
    pZVar2[uVar15].job_mutex.__align = lVar4;
    *(undefined8 *)((long)&pZVar2[uVar15].job_mutex + 8) = uVar5;
    puVar1 = (undefined8 *)((long)&pZVar2[uVar15].job_mutex + 0x10);
    *puVar1 = uVar6;
    puVar1[1] = uVar7;
    pZVar2[uVar15].job_mutex.__data.__list.__next = p_Var3;
    pZVar2 = mtctx->jobs;
    puVar1 = (undefined8 *)((long)&pZVar2[uVar15].job_cond + 0x20);
    *puVar1 = uVar12;
    puVar1[1] = uVar13;
    pZVar2[uVar15].job_cond.__data.__wseq = _Var8;
    (&pZVar2[uVar15].job_cond.__align)[1] = lVar9;
    puVar1 = (undefined8 *)((long)&pZVar2[uVar15].job_cond + 0x10);
    *puVar1 = uVar10;
    puVar1[1] = uVar11;
    uVar14 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar14;
  } while (uVar14 <= mtctx->jobIDMask);
  (mtctx->inBuff).buffer.start = (void *)0x0;
  (mtctx->inBuff).buffer.capacity = 0;
  (mtctx->inBuff).filled = 0;
  mtctx->allJobsCompleted = 1;
  return;
}

Assistant:

static void ZSTDMT_releaseAllJobResources(ZSTDMT_CCtx* mtctx)
{
    unsigned jobID;
    DEBUGLOG(3, "ZSTDMT_releaseAllJobResources");
    for (jobID=0; jobID <= mtctx->jobIDMask; jobID++) {
        /* Copy the mutex/cond out */
        ZSTD_pthread_mutex_t const mutex = mtctx->jobs[jobID].job_mutex;
        ZSTD_pthread_cond_t const cond = mtctx->jobs[jobID].job_cond;

        DEBUGLOG(4, "job%02u: release dst address %08X", jobID, (U32)(size_t)mtctx->jobs[jobID].dstBuff.start);
        ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[jobID].dstBuff);

        /* Clear the job description, but keep the mutex/cond */
        ZSTD_memset(&mtctx->jobs[jobID], 0, sizeof(mtctx->jobs[jobID]));
        mtctx->jobs[jobID].job_mutex = mutex;
        mtctx->jobs[jobID].job_cond = cond;
    }
    mtctx->inBuff.buffer = g_nullBuffer;
    mtctx->inBuff.filled = 0;
    mtctx->allJobsCompleted = 1;
}